

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teamcity_messages.cpp
# Opt level: O3

void __thiscall
jetbrains::teamcity::TeamcityMessages::suiteFinished
          (TeamcityMessages *this,string *name,string *flowId)

{
  pointer pcVar1;
  string value;
  RaiiMessage msg;
  undefined8 in_stack_ffffffffffffff98;
  RaiiMessage in_stack_ffffffffffffffa0;
  RaiiMessage RVar2;
  long *name_00;
  undefined8 in_stack_ffffffffffffffb0;
  long local_48 [2];
  string local_38;
  
  anon_unknown_1::RaiiMessage::RaiiMessage
            ((RaiiMessage *)&stack0xffffffffffffffa0,"testSuiteFinished",this->m_out);
  pcVar1 = (name->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + name->_M_string_length);
  RVar2.m_out = in_stack_ffffffffffffffa0.m_out;
  anon_unknown_1::RaiiMessage::writeProperty
            ((RaiiMessage *)in_stack_ffffffffffffffa0.m_out,"name",&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  pcVar1 = (flowId->_M_dataplus)._M_p;
  name_00 = local_48;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&stack0xffffffffffffffa8,pcVar1,pcVar1 + flowId->_M_string_length);
  value._M_string_length = (size_type)RVar2.m_out;
  value._M_dataplus._M_p = (pointer)in_stack_ffffffffffffff98;
  value.field_2._M_allocated_capacity = (size_type)name_00;
  value.field_2._8_8_ = in_stack_ffffffffffffffb0;
  anon_unknown_1::RaiiMessage::writePropertyIfNonEmpty
            ((RaiiMessage *)&stack0xffffffffffffffa0,(char *)name_00,value);
  if (name_00 != local_48) {
    operator_delete(name_00,local_48[0] + 1);
  }
  anon_unknown_1::RaiiMessage::~RaiiMessage((RaiiMessage *)in_stack_ffffffffffffffa0.m_out);
  return;
}

Assistant:

void TeamcityMessages::suiteFinished(const std::string& name, const std::string& flowId)
{
    RaiiMessage msg("testSuiteFinished", *m_out);
    msg.writeProperty("name", name);
    msg.writePropertyIfNonEmpty("flowId", flowId);
}